

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRoof::IfcRoof(IfcRoof *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcRoof";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__0087a6e8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x87a5b8;
  *(undefined8 *)&this->field_0x178 = 0x87a6d0;
  *(undefined8 *)&this->field_0x88 = 0x87a5e0;
  *(undefined8 *)&this->field_0x98 = 0x87a608;
  *(undefined8 *)&this->field_0xd0 = 0x87a630;
  *(undefined8 *)&this->field_0x100 = 0x87a658;
  *(undefined8 *)&this->field_0x138 = 0x87a680;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x87a6a8;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRoof() : Object("IfcRoof") {}